

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O0

int fdsocket_try_send(FdSocket *fds)

{
  size_t sVar1;
  unsigned_long data_00;
  int *piVar2;
  ptrlen pVar3;
  void *local_38;
  ptrlen data;
  ssize_t ret;
  int sent;
  FdSocket *fds_local;
  
  ret._4_4_ = 0;
  if (fds->opener == (DeferredSocketOpener *)0x0) {
    while (sVar1 = bufchain_size(&fds->pending_output_data), sVar1 != 0) {
      pVar3 = bufchain_prefix(&fds->pending_output_data);
      local_38 = pVar3.ptr;
      data.ptr = (void *)pVar3.len;
      data_00 = write(fds->outfd,local_38,(size_t)data.ptr);
      noise_ultralight(NOISE_SOURCE_IOID,data_00);
      if (((long)data_00 < 0) && (piVar2 = __errno_location(), *piVar2 != 0xb)) {
        if (fds->pending_error == 0) {
          piVar2 = __errno_location();
          fds->pending_error = *piVar2;
          queue_toplevel_callback(fdsocket_error_callback,fds);
        }
        return 0;
      }
      if ((long)data_00 < 1) break;
      bufchain_consume(&fds->pending_output_data,data_00);
      ret._4_4_ = ret._4_4_ + (int)data_00;
    }
    if (fds->outgoingeof == EOF_PENDING) {
      del234(fdsocket_by_outfd,fds);
      close(fds->outfd);
      uxsel_del(fds->outfd);
      fds->outfd = -1;
      fds->outgoingeof = EOF_SENT;
    }
    sVar1 = bufchain_size(&fds->pending_output_data);
    if (sVar1 == 0) {
      uxsel_del(fds->outfd);
    }
    else {
      uxsel_set(fds->outfd,2,fdsocket_select_result_output);
    }
    fds_local._4_4_ = ret._4_4_;
  }
  else {
    fds_local._4_4_ = 0;
  }
  return fds_local._4_4_;
}

Assistant:

static int fdsocket_try_send(FdSocket *fds)
{
    int sent = 0;

    if (fds->opener)
        return sent;

    while (bufchain_size(&fds->pending_output_data) > 0) {
        ssize_t ret;

        ptrlen data = bufchain_prefix(&fds->pending_output_data);
        ret = write(fds->outfd, data.ptr, data.len);
        noise_ultralight(NOISE_SOURCE_IOID, ret);
        if (ret < 0 && errno != EWOULDBLOCK) {
            if (!fds->pending_error) {
                fds->pending_error = errno;
                queue_toplevel_callback(fdsocket_error_callback, fds);
            }
            return 0;
        } else if (ret <= 0) {
            break;
        } else {
            bufchain_consume(&fds->pending_output_data, ret);
            sent += ret;
        }
    }

    if (fds->outgoingeof == EOF_PENDING) {
        del234(fdsocket_by_outfd, fds);
        close(fds->outfd);
        uxsel_del(fds->outfd);
        fds->outfd = -1;
        fds->outgoingeof = EOF_SENT;
    }

    if (bufchain_size(&fds->pending_output_data) == 0)
        uxsel_del(fds->outfd);
    else
        uxsel_set(fds->outfd, SELECT_W, fdsocket_select_result_output);

    return sent;
}